

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O2

Constant *
spvtools::opt::anon_unknown_0::FoldScalarUConvert
          (Type *result_type,Constant *a,ConstantManager *const_mgr)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  uint64_t word;
  undefined4 extraout_var_00;
  unsigned_long result;
  Constant *pCVar3;
  
  if (result_type == (Type *)0x0) {
    __assert_fail("result_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x6a6,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldScalarUConvert(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
                 );
  }
  if (a == (Constant *)0x0) {
    __assert_fail("a != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x6a7,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldScalarUConvert(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
                 );
  }
  if (const_mgr == (ConstantManager *)0x0) {
    __assert_fail("const_mgr != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x6a8,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldScalarUConvert(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
                 );
  }
  iVar1 = (*result_type->_vptr_Type[10])();
  if ((Integer *)CONCAT44(extraout_var,iVar1) != (Integer *)0x0) {
    word = analysis::Constant::GetZeroExtendedValue(a);
    iVar2 = (*a->type_->_vptr_Type[10])();
    result = utils::ClearHighBits<unsigned_long>
                       (word,(ulong)(0x40 - *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x24)));
    pCVar3 = analysis::ConstantManager::GenerateIntegerConstant
                       (const_mgr,(Integer *)CONCAT44(extraout_var,iVar1),result);
    return pCVar3;
  }
  __assert_fail("integer_type && \"The result type of an UConvert\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                ,0x6aa,
                "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldScalarUConvert(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
               );
}

Assistant:

const analysis::Constant* FoldScalarUConvert(
    const analysis::Type* result_type, const analysis::Constant* a,
    analysis::ConstantManager* const_mgr) {
  assert(result_type != nullptr);
  assert(a != nullptr);
  assert(const_mgr != nullptr);
  const analysis::Integer* integer_type = result_type->AsInteger();
  assert(integer_type && "The result type of an UConvert");
  uint64_t value = a->GetZeroExtendedValue();

  // If the operand was an unsigned value with less than 32-bit, it would have
  // been sign extended earlier, and we need to clear those bits.
  auto* operand_type = a->type()->AsInteger();
  value = utils::ClearHighBits(value, 64 - operand_type->width());
  return const_mgr->GenerateIntegerConstant(integer_type, value);
}